

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdi::ControlLabel::ControlLabel(ControlLabel *this,QWidget *parent)

{
  bool bVar1;
  long in_FS_OFFSET;
  double dVar2;
  undefined1 auVar3 [16];
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007f6048;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__ControlLabel_007f61f8;
  QPixmap::QPixmap(&this->label);
  this->isPressed = false;
  QWidget::setFocusPolicy(&this->super_QWidget,NoFocus);
  updateWindowIcon(this);
  auVar3 = QPixmap::deviceIndependentSize();
  dVar2 = (double)((ulong)auVar3._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar3._0_8_;
  bVar1 = 2147483647.0 < dVar2;
  if (dVar2 <= -2147483648.0) {
    dVar2 = -2147483648.0;
  }
  local_20.wd.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
  dVar2 = (double)((ulong)auVar3._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar3._8_8_;
  bVar1 = 2147483647.0 < dVar2;
  if (dVar2 <= -2147483648.0) {
    dVar2 = -2147483648.0;
  }
  local_20.ht.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
  QWidget::setFixedSize(&this->super_QWidget,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ControlLabel::ControlLabel(QWidget *parent)
    : QWidget(parent), isPressed(false)
{
    setFocusPolicy(Qt::NoFocus);
    updateWindowIcon();
    setFixedSize(label.deviceIndependentSize().toSize());
}